

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O2

c_v64 c_v64_ssub_s8(c_v64 a,c_v64 b)

{
  char cVar1;
  char cVar2;
  int c;
  long lVar3;
  uint8_t uVar4;
  c_v64 b_local;
  c_v64 a_local;
  c_v64 t;
  
  a_local = a;
  b_local = b;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
    cVar1 = a_local.s8[lVar3];
    cVar2 = b_local.s8[lVar3];
    uVar4 = cVar1 - cVar2;
    if (SBORROW1(cVar1,cVar2)) {
      uVar4 = (-1 < (char)(cVar1 - cVar2)) + '\x7f';
    }
    t.u8[lVar3] = uVar4;
  }
  return (c_v64)t.u64;
}

Assistant:

SIMD_INLINE c_v64 c_v64_ssub_s8(c_v64 a, c_v64 b) {
  c_v64 t;
  int c;
  for (c = 0; c < 8; c++) {
    int16_t d = (int16_t)a.s8[c] - (int16_t)b.s8[c];
    t.s8[c] = SIMD_CLAMP(d, -128, 127);
  }
  return t;
}